

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procfs-exepath.c
# Opt level: O0

int uv_exepath(char *buffer,size_t *size)

{
  int *piVar1;
  size_t local_28;
  ssize_t n;
  size_t *size_local;
  char *buffer_local;
  
  if (((buffer == (char *)0x0) || (size == (size_t *)0x0)) || (*size == 0)) {
    buffer_local._4_4_ = -0x16;
  }
  else {
    local_28 = *size - 1;
    if (0 < (long)local_28) {
      local_28 = readlink("/proc/self/exe",buffer,local_28);
    }
    if (local_28 == 0xffffffffffffffff) {
      piVar1 = __errno_location();
      buffer_local._4_4_ = -*piVar1;
    }
    else {
      buffer[local_28] = '\0';
      *size = local_28;
      buffer_local._4_4_ = 0;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_exepath(char* buffer, size_t* size) {
  ssize_t n;

  if (buffer == NULL || size == NULL || *size == 0)
    return UV_EINVAL;

  n = *size - 1;
  if (n > 0)
    n = readlink("/proc/self/exe", buffer, n);

  if (n == -1)
    return UV__ERR(errno);

  buffer[n] = '\0';
  *size = n;

  return 0;
}